

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall pbrt::ParameterDictionary::remove(ParameterDictionary *this,char *__filename)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  undefined8 *puVar2;
  ParsedParameter *pPVar3;
  size_t __n;
  int iVar4;
  ParsedParameter **in_RAX;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar5;
  long lVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  size_t sVar8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar9;
  
  sVar8 = (this->params).nStored;
  if (sVar8 != 0) {
    paVar7 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
              *)(this->params).ptr;
    paVar1 = &(this->params).field_2;
    paVar9 = paVar7;
    if (paVar7 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                   *)0x0) {
      paVar9 = paVar1;
    }
    lVar6 = -(long)paVar9;
    do {
      pPVar3 = paVar9->fixed[0];
      __n = (pPVar3->name)._M_string_length;
      if ((__n == *(size_t *)(__filename + 8)) &&
         ((__n == 0 ||
          (iVar4 = bcmp((pPVar3->name)._M_dataplus._M_p,*(void **)__filename,__n), iVar4 == 0)))) {
        iVar4 = std::__cxx11::string::compare((char *)pPVar3);
        paVar7 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                  *)(this->params).ptr;
        if (iVar4 == 0) {
          sVar8 = (this->params).nStored;
          if (paVar7 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                         *)0x0) {
            paVar7 = paVar1;
          }
          if (paVar9 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                         *)((long)paVar7 + sVar8 * 8 + -8)) {
            lVar6 = (long)paVar7 - lVar6;
            do {
              puVar2 = (undefined8 *)((lVar6 + 8) - (long)paVar7);
              puVar2[-1] = *puVar2;
              paVar9 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                        *)(this->params).ptr;
              if (paVar9 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                             *)0x0) {
                paVar9 = paVar1;
              }
              lVar6 = lVar6 + 8;
            } while (puVar2 != (undefined8 *)((long)paVar9 + sVar8 * 8 + -8));
          }
          in_RAX = (ParsedParameter **)(sVar8 - 1);
          (this->params).nStored = (size_t)in_RAX;
          break;
        }
        sVar8 = (this->params).nStored;
      }
      paVar9 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                *)((long)paVar9 + 8);
      paVar5 = paVar7;
      if (paVar7 == (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                     *)0x0) {
        paVar5 = paVar1;
      }
      lVar6 = lVar6 + -8;
      in_RAX = (ParsedParameter **)((long)paVar5 + sVar8 * 8);
    } while (paVar9 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                        *)in_RAX);
  }
  return (int)in_RAX;
}

Assistant:

void ParameterDictionary::remove(const std::string &name, const char *typeName) {
    for (auto iter = params.begin(); iter != params.end(); ++iter)
        if ((*iter)->name == name && (*iter)->type == typeName) {
            params.erase(iter);
            return;
        }
}